

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O3

monst * make_familiar(obj *otmp,xchar x,xchar y,boolean quietly)

{
  boolean bVar1;
  int iVar2;
  uint uVar3;
  permonst *ptr;
  monst *mtmp;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  char *line;
  uint uVar4;
  
  uVar4 = 0x65;
  do {
    if (otmp == (obj *)0x0) {
      uVar3 = mt_random();
      if (uVar3 * -0x55555555 < 0x55555556) {
        iVar2 = pet_type();
        ptr = mons + iVar2;
      }
      else {
        ptr = rndmonst(level);
        if (ptr == (permonst *)0x0) {
          if (quietly != '\0') {
            return (monst *)0x0;
          }
          line = "There seems to be nothing available for a familiar.";
          goto LAB_00171d16;
        }
      }
    }
    else {
      iVar2 = otmp->corpsenm;
      ptr = mons + iVar2;
      if (((mvitals[iVar2].mvflags & 1) != 0) && (iVar2 = mbirth_limit(iVar2), iVar2 != 0x78)) {
        if (quietly != '\0') {
          return (monst *)0x0;
        }
        line = "... into a pile of dust.";
        goto LAB_00171d16;
      }
    }
    mtmp = makemon(ptr,level,(int)CONCAT71(in_register_00000031,x),
                   (int)CONCAT71(in_register_00000011,y),0x84);
    if ((otmp != (obj *)0x0) && (mtmp == (monst *)0x0)) {
      if (quietly != '\0') {
        return (monst *)0x0;
      }
      line = "The figurine writhes and then shatters into pieces!";
LAB_00171d16:
      pline(line);
      return (monst *)0x0;
    }
    if (mtmp != (monst *)0x0) {
      bVar1 = is_pool(level,(int)mtmp->mx,(int)mtmp->my);
      if ((bVar1 != '\0') && (iVar2 = minliquid(mtmp), iVar2 != 0)) {
        return (monst *)0x0;
      }
      initedog(mtmp);
      mtmp->field_0x62 = mtmp->field_0x62 & 0xf7;
      if (otmp == (obj *)0x0) goto LAB_00171cd4;
      uVar4 = mt_random();
      uVar4 = uVar4 % 10;
      if (uVar4 < 3) {
        if (uVar4 != 0) goto LAB_00171c8b;
      }
      else if ((*(uint *)&otmp->field_0x4a & 2) == 0) {
        uVar4 = (*(uint *)&otmp->field_0x4a & 1) + 1;
LAB_00171c8b:
        mtmp->mtame = '\0';
        if (uVar4 == 2) {
          if (quietly == '\0') {
            pline("You get a bad feeling about this.");
          }
          mtmp->field_0x62 = mtmp->field_0x62 & 0xbf;
          set_malign(mtmp);
        }
      }
      if (otmp->onamelth != '\0') {
        mtmp = christen_monst(mtmp,(char *)((long)otmp->oextra + (long)otmp->oxlth));
      }
LAB_00171cd4:
      set_malign(mtmp);
      newsym((int)mtmp->mx,(int)mtmp->my);
      if (mtmp->mtame == '\0') {
        return mtmp;
      }
      bVar1 = attacktype(mtmp->data,0xfe);
      if (bVar1 != '\0') {
        mtmp->weapon_check = '\x03';
        mon_wield_item(mtmp);
        return mtmp;
      }
      return mtmp;
    }
    uVar4 = uVar4 - 1;
    if (uVar4 < 2) {
      return (monst *)0x0;
    }
  } while( true );
}

Assistant:

struct monst *make_familiar(struct obj *otmp, xchar x, xchar y, boolean quietly)
{
	const struct permonst *pm;
	struct monst *mtmp = 0;
	int chance, trycnt = 100;

	do {
	    if (otmp) {	/* figurine; otherwise spell */
		int mndx = otmp->corpsenm;
		pm = &mons[mndx];
		/* activating a figurine provides one way to exceed the
		   maximum number of the target critter created--unless
		   it has a special limit (erinys, Nazgul) */
		if ((mvitals[mndx].mvflags & G_EXTINCT) &&
			mbirth_limit(mndx) != MAXMONNO) {
		    if (!quietly)
			/* have just been given "You <do something with>
			   the figurine and it transforms." message */
			pline("... into a pile of dust.");
		    break;	/* mtmp is null */
		}
	    } else if (!rn2(3)) {
		pm = &mons[pet_type()];
	    } else {
		pm = rndmonst(level);
		if (!pm) {
		  if (!quietly)
		    pline("There seems to be nothing available for a familiar.");
		  break;
		}
	    }

	    mtmp = makemon(pm, level, x, y, MM_EDOG|MM_IGNOREWATER);
	    if (otmp && !mtmp) { /* monster was genocided or square occupied */
	 	if (!quietly)
		   pline("The figurine writhes and then shatters into pieces!");
		break;
	    }
	} while (!mtmp && --trycnt > 0);

	if (!mtmp) return NULL;

	if (is_pool(level, mtmp->mx, mtmp->my) && minliquid(mtmp))
		return NULL;

	initedog(mtmp);
	mtmp->msleeping = 0;
	if (otmp) { /* figurine; resulting monster might not become a pet */
	    chance = rn2(10);	/* 0==tame, 1==peaceful, 2==hostile */
	    if (chance > 2) chance = otmp->blessed ? 0 : !otmp->cursed ? 1 : 2;
	    /* 0,1,2:  b=80%,10,10; nc=10%,80,10; c=10%,10,80 */
	    if (chance > 0) {
		mtmp->mtame = 0;	/* not tame after all */
		if (chance == 2) { /* hostile (cursed figurine) */
		    if (!quietly)
		       pline("You get a bad feeling about this.");
		    mtmp->mpeaceful = 0;
		    set_malign(mtmp);
		}
	    }
	    /* if figurine has been named, give same name to the monster */
	    if (otmp->onamelth)
		mtmp = christen_monst(mtmp, ONAME(otmp));
	}
	set_malign(mtmp); /* more alignment changes */
	newsym(mtmp->mx, mtmp->my);

	/* must wield weapon immediately since pets will otherwise drop it */
	if (mtmp->mtame && attacktype(mtmp->data, AT_WEAP)) {
		mtmp->weapon_check = NEED_HTH_WEAPON;
		mon_wield_item(mtmp);
	}
	return mtmp;
}